

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint64_t tag,char *ptr,MessageLite *extendee,
          InternalMetadata *metadata,ParseContext *ctx)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  undefined1 local_80 [8];
  ExtensionInfo extension;
  bool was_packed_on_wire;
  int number;
  GeneratedExtensionFinder finder;
  ParseContext *ctx_local;
  InternalMetadata *metadata_local;
  MessageLite *extendee_local;
  char *ptr_local;
  uint64_t tag_local;
  ExtensionSet *this_local;
  
  finder.extendee_ = (MessageLite *)ctx;
  GeneratedExtensionFinder::GeneratedExtensionFinder
            ((GeneratedExtensionFinder *)&stack0xffffffffffffffb8,extendee);
  extension.lazy_eager_verify_func._4_4_ = (int)(tag >> 3);
  ExtensionInfo::ExtensionInfo((ExtensionInfo *)local_80);
  bVar1 = FindExtensionInfoFromFieldNumber<google::protobuf::internal::GeneratedExtensionFinder>
                    (this,(uint)tag & 7,extension.lazy_eager_verify_func._4_4_,
                     (GeneratedExtensionFinder *)&stack0xffffffffffffffb8,(ExtensionInfo *)local_80,
                     (bool *)((long)&extension.lazy_eager_verify_func + 3));
  if (bVar1) {
    this_local = (ExtensionSet *)
                 ParseFieldWithExtensionInfo<std::__cxx11::string>
                           (this,extension.lazy_eager_verify_func._4_4_,
                            (bool)(extension.lazy_eager_verify_func._3_1_ & 1),
                            (ExtensionInfo *)local_80,metadata,ptr,(ParseContext *)finder.extendee_)
    ;
  }
  else {
    unknown = InternalMetadata::mutable_unknown_fields<std::__cxx11::string>(metadata);
    this_local = (ExtensionSet *)
                 UnknownFieldParse((uint)tag,unknown,ptr,(ParseContext *)finder.extendee_);
  }
  return (char *)this_local;
}

Assistant:

const char* ExtensionSet::ParseField(uint64_t tag, const char* ptr,
                                     const MessageLite* extendee,
                                     internal::InternalMetadata* metadata,
                                     internal::ParseContext* ctx) {
  GeneratedExtensionFinder finder(extendee);
  int number = tag >> 3;
  bool was_packed_on_wire;
  ExtensionInfo extension;
  if (!FindExtensionInfoFromFieldNumber(tag & 7, number, &finder, &extension,
                                        &was_packed_on_wire)) {
    return UnknownFieldParse(
        tag, metadata->mutable_unknown_fields<std::string>(), ptr, ctx);
  }
  return ParseFieldWithExtensionInfo<std::string>(
      number, was_packed_on_wire, extension, metadata, ptr, ctx);
}